

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<unsigned_int>::setCapacity(Vector<unsigned_int> *this,size_t newSize)

{
  uint *puVar1;
  uint *puVar2;
  RemoveConst<kj::StringPtr> *pRVar3;
  StringPtr *pSVar4;
  StringPtr *pSVar5;
  ulong __n;
  ArrayBuilder<kj::StringPtr> newBuilder;
  ArrayBuilder<kj::StringPtr> local_38;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1 >> 2)) {
    (this->builder).pos = puVar1 + newSize;
  }
  pSVar5 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (4,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = (StringPtr *)((long)&(pSVar5->content).ptr + newSize * 4);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  puVar1 = (this->builder).ptr;
  puVar2 = (this->builder).pos;
  local_38.ptr = pSVar5;
  if (puVar1 != puVar2) {
    __n = (long)puVar2 - (long)puVar1 & 0xfffffffffffffffc;
    local_38.pos = pSVar5;
    memcpy(pSVar5,puVar1,__n);
    pSVar5 = (StringPtr *)((long)&(pSVar5->content).ptr + __n);
  }
  local_38.pos = pSVar5;
  ArrayBuilder<unsigned_int>::operator=(&this->builder,&local_38);
  pSVar4 = local_38.endPtr;
  pRVar3 = local_38.pos;
  pSVar5 = local_38.ptr;
  if (local_38.ptr != (StringPtr *)0x0) {
    local_38.ptr = (StringPtr *)0x0;
    local_38.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_38.endPtr = (StringPtr *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,pSVar5,4,(long)pRVar3 - (long)pSVar5 >> 2,
               (long)pSVar4 - (long)pSVar5 >> 2,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }